

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

bool IsLibraryFunction(ParseNode *expr,ScriptContext *scriptContext)

{
  ParseNode *this;
  ParseNode *this_00;
  PropertyId PVar1;
  ParseNodeBin *pPVar2;
  ParseNodeName *pPVar3;
  
  if (expr == (ParseNode *)0x0) {
    return false;
  }
  if (expr->nop == knopDot) {
    pPVar2 = ParseNode::AsParseNodeBin(expr);
    this = pPVar2->pnode1;
    pPVar2 = ParseNode::AsParseNodeBin(expr);
    this_00 = pPVar2->pnode2;
    if (((this_00 != (ParseNode *)0x0 && this != (ParseNode *)0x0) && (this->nop == knopName)) &&
       (this_00->nop == knopName)) {
      pPVar3 = ParseNode::AsParseNodeName(this);
      if ((pPVar3->sym == (Symbol *)0x0) || ((pPVar3->sym->field_0x42 & 8) != 0)) {
        pPVar3 = ParseNode::AsParseNodeName(this);
        PVar1 = ParseNodeName::PropertyIdFromNameNode(pPVar3);
        if (PVar1 == 0xd7) {
          pPVar3 = ParseNode::AsParseNodeName(this_00);
          PVar1 = ParseNodeName::PropertyIdFromNameNode(pPVar3);
          return PVar1 - 0x1dU < 0x26;
        }
      }
    }
  }
  return false;
}

Assistant:

bool IsLibraryFunction(ParseNode* expr, Js::ScriptContext* scriptContext)
{
    if (expr && expr->nop == knopDot)
    {
        ParseNode* lhs = expr->AsParseNodeBin()->pnode1;
        ParseNode* rhs = expr->AsParseNodeBin()->pnode2;
        if ((lhs != nullptr) && (rhs != nullptr) && (lhs->nop == knopName) && (rhs->nop == knopName))
        {
            Symbol* lsym = lhs->AsParseNodeName()->sym;
            if ((lsym == nullptr || lsym->GetIsGlobal()) && lhs->AsParseNodeName()->PropertyIdFromNameNode() == Js::PropertyIds::Math)
            {
                return IsMathLibraryId(rhs->AsParseNodeName()->PropertyIdFromNameNode());
            }
        }
    }
    return false;
}